

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O1

bool __thiscall tinyusdz::Stage::add_root_prim(Stage *this,Prim *prim,bool rename_prim_name)

{
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  Path *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  Prim *__args;
  bool bVar4;
  size_type sVar5;
  ostream *poVar6;
  char *in_RCX;
  undefined7 in_register_00000011;
  ulong uVar7;
  pointer pPVar8;
  char *pcVar9;
  long lVar10;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar11;
  string unique_name;
  string elementName;
  ostringstream ss_e;
  string local_240;
  undefined4 local_21c;
  key_type local_218;
  string local_1f8;
  Path *local_1d8;
  Prim *local_1d0;
  undefined1 local_1c8 [32];
  _Alloc_hider local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Alloc_hider local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  _Alloc_hider local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118 [12];
  long *local_50 [2];
  long local_40 [2];
  
  local_21c = (undefined4)CONCAT71(in_register_00000011,rename_prim_name);
  this_01 = &prim->_elementPath;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  pcVar3 = (prim->_elementPath)._prim_part._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_218,pcVar3,pcVar3 + (prim->_elementPath)._prim_part._M_string_length);
  if (local_218._M_string_length == 0) {
    if ((char)local_21c == '\0') {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc",
                 0x4f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"add_root_prim",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
      poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x281);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      pcVar9 = "Prim has empty elementName.";
      lVar10 = 0x1b;
    }
    else {
      in_RCX = "default";
      ::std::__cxx11::string::_M_replace((ulong)&local_218,0,(char *)0x0,0x5fa101);
      bVar4 = SetPrimElementName(&prim->_data,&local_218);
      if (bVar4) {
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"");
        Path::Path((Path *)local_1c8,&local_218,&local_240);
        Path::operator=(this_01,(Path *)local_1c8);
        if (local_128._M_p != local_1c8 + 0xb0) {
          operator_delete(local_128._M_p,local_118[0]._M_allocated_capacity + 1);
        }
        if (local_148._M_p != local_1c8 + 0x90) {
          operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
        }
        if (local_168._M_p != local_1c8 + 0x70) {
          operator_delete(local_168._M_p,local_158._M_allocated_capacity + 1);
        }
        if (local_188._M_p != local_1c8 + 0x50) {
          operator_delete(local_188._M_p,local_178._M_allocated_capacity + 1);
        }
        if (local_1a8._M_p != local_1c8 + 0x30) {
          operator_delete(local_1a8._M_p,local_198._M_allocated_capacity + 1);
        }
        if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1c8._0_8_ !=
            (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1c8 + 0x10)) {
          operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,
                          CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                                   local_240.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_0031dea9;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc",
                 0x4f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"add_root_prim",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
      poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x27d);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      pcVar9 = "Internal error. cannot modify Prim\'s elementName";
      lVar10 = 0x30;
    }
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pcVar9,lVar10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_240._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
LAB_0031e627:
      operator_delete(local_240._M_dataplus._M_p,
                      CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                               local_240.field_2._M_local_buf[0]) + 1);
    }
LAB_0031e634:
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    ::std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x70));
  }
  else {
LAB_0031dea9:
    this_00 = &this->_root_node_nameSet;
    local_1d8 = this_01;
    local_1d0 = prim;
    if (((long)(this->_root_nodes).
               super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(this->_root_nodes).
               super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
               super__Vector_impl_data._M_start >> 4) * 0x21cfb2b78c13521d -
        (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(&this_00->_M_t,
                 (_Link_type)
                 (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      p_Var1 = &(this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header;
      in_RCX = (char *)0x0;
      (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      pPVar8 = (this->_root_nodes).
               super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
          _M_impl.super__Vector_impl_data._M_finish != pPVar8) {
        lVar10 = 0x1a0;
        uVar7 = 0;
        do {
          if (*(long *)((long)&(pPVar8->_abs_path)._prim_part._M_string_length + lVar10) == 0) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                       ,0x4f);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c8,"add_root_prim",0xd);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
            poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x28a);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            pcVar9 = "Internal error: Existing root Prim\'s elementName is empty.";
            lVar10 = 0x3a;
LAB_0031e980:
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pcVar9,lVar10)
            ;
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\n",1);
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_240._M_dataplus._M_p)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240._M_dataplus._M_p == &local_240.field_2) goto LAB_0031e634;
            goto LAB_0031e627;
          }
          sVar5 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&this_00->_M_t,
                          (key_type *)
                          ((long)&(pPVar8->_abs_path)._prim_part._M_dataplus._M_p + lVar10));
          if (sVar5 != 0) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                       ,0x4f);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c8,"add_root_prim",0xd);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
            poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x28e);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            pcVar9 = "Internal error: Stage contains root Prim with same elementName.";
            lVar10 = 0x3f;
            goto LAB_0031e980;
          }
          in_RCX = (char *)((long)&(((this->_root_nodes).
                                     super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_abs_path).
                                   _prim_part + lVar10);
          pVar11 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::_M_get_insert_equal_pos(&this_00->_M_t,(key_type *)in_RCX);
          local_1c8._0_8_ = this_00;
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::
          _M_insert_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)this_00,pVar11.first,pVar11.second,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX,
                     (_Alloc_node *)local_1c8);
          uVar7 = uVar7 + 1;
          pPVar8 = (this->_root_nodes).
                   super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar10 = lVar10 + 0x350;
        } while (uVar7 < (ulong)(((long)(this->_root_nodes).
                                        super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar8 >>
                                 4) * 0x21cfb2b78c13521d));
      }
    }
    sVar5 = ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&this_00->_M_t,&local_218);
    __args = local_1d0;
    if (sVar5 == 0) {
LAB_0031e149:
      pVar11 = ::std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::_M_get_insert_equal_pos(&this_00->_M_t,&local_218);
      local_1c8._0_8_ = this_00;
      ::std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::
      _M_insert_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)this_00,pVar11.first,pVar11.second,&local_218,(_Alloc_node *)local_1c8);
      ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
                (&this->_root_nodes,__args);
      this->_dirty = true;
      bVar4 = true;
      goto LAB_0031e657;
    }
    if ((char)local_21c == '\0') {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc",
                 0x4f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"add_root_prim",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
      poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x2a4);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f8,"Prim name(elementName) {} already exists in children.\n","");
      fmt::format<std::__cxx11::string>
                ((string *)&local_240,(fmt *)&local_1f8,&local_1d8->_prim_part,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX);
      poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c8,local_240._M_dataplus._M_p,local_240._M_string_length
                         );
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,
                        CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                                 local_240.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_240._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,
                        CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                                 local_240.field_2._M_local_buf[0]) + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      ::std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x70));
      bVar4 = false;
      goto LAB_0031e657;
    }
    paVar2 = &local_240.field_2;
    local_240._M_string_length = 0;
    local_240.field_2._M_local_buf[0] = '\0';
    local_240._M_dataplus._M_p = (pointer)paVar2;
    bVar4 = makeUniqueName(this_00,&local_218,&local_240);
    if (bVar4) {
      ::std::__cxx11::string::_M_assign((string *)&local_218);
      bVar4 = SetPrimElementName(&__args->_data,&local_218);
      if (bVar4) {
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
        Path::Path((Path *)local_1c8,&local_218,&local_1f8);
        Path::operator=(local_1d8,(Path *)local_1c8);
        if (local_128._M_p != local_1c8 + 0xb0) {
          operator_delete(local_128._M_p,local_118[0]._M_allocated_capacity + 1);
        }
        if (local_148._M_p != local_1c8 + 0x90) {
          operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
        }
        if (local_168._M_p != local_1c8 + 0x70) {
          operator_delete(local_168._M_p,local_158._M_allocated_capacity + 1);
        }
        if (local_188._M_p != local_1c8 + 0x50) {
          operator_delete(local_188._M_p,local_178._M_allocated_capacity + 1);
        }
        if (local_1a8._M_p != local_1c8 + 0x30) {
          operator_delete(local_1a8._M_p,local_198._M_allocated_capacity + 1);
        }
        if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1c8._0_8_ !=
            (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1c8 + 0x10)) {
          operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != paVar2) {
          operator_delete(local_240._M_dataplus._M_p,
                          CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                                   local_240.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_0031e149;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc",
                 0x4f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"add_root_prim",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
      poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x2a0);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"Internal error. cannot modify Prim\'s elementName.",0x31);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\n",1);
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1f8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) goto LAB_0031e7e6;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc",
                 0x4f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"add_root_prim",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
      poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x299);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      local_50[0] = local_40;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Internal error. cannot assign unique name for `{}`.\n","");
      fmt::format<std::__cxx11::string>
                ((string *)&local_1f8,(fmt *)local_50,(string *)&local_218,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX);
      poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length
                         );
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1f8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
LAB_0031e7e6:
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    ::std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x70));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != paVar2) {
      operator_delete(local_240._M_dataplus._M_p,
                      CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                               local_240.field_2._M_local_buf[0]) + 1);
    }
  }
  bVar4 = false;
LAB_0031e657:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool Stage::add_root_prim(Prim &&prim, bool rename_prim_name) {

#if defined(TINYUSDZ_ENABLE_THREAD)
  // TODO: Only take a lock when dirty.
  std::lock_guard<std::mutex> lock(_mutex);
#endif


  std::string elementName = prim.element_name();

  if (elementName.empty()) {
    if (rename_prim_name) {

      // assign default name `default`
      elementName = "default";

      if (!SetPrimElementName(prim.get_data(), elementName)) {
        PUSH_ERROR_AND_RETURN("Internal error. cannot modify Prim's elementName");
      }
      prim.element_path() = Path(elementName, /* prop_part */"");
    } else {
      PUSH_ERROR_AND_RETURN("Prim has empty elementName.");
    }
  }

  if (_root_nodes.size() != _root_node_nameSet.size()) {
    // Rebuild nameSet
    _root_node_nameSet.clear();
    for (size_t i = 0; i < _root_nodes.size(); i++) {
      if (_root_nodes[i].element_name().empty()) {
        PUSH_ERROR_AND_RETURN("Internal error: Existing root Prim's elementName is empty.");
      }

      if (_root_node_nameSet.count(_root_nodes[i].element_name())) {
        PUSH_ERROR_AND_RETURN("Internal error: Stage contains root Prim with same elementName.");
      }

      _root_node_nameSet.insert(_root_nodes[i].element_name());
    }
  }

  if (_root_node_nameSet.count(elementName)) {
    if (rename_prim_name) {
      std::string unique_name;
      if (!makeUniqueName(_root_node_nameSet, elementName, &unique_name)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Internal error. cannot assign unique name for `{}`.\n", elementName));
      }

      elementName = unique_name;

      // Need to modify both Prim::data::name and Prim::elementPath
      if (!SetPrimElementName(prim.get_data(), elementName)) {
        PUSH_ERROR_AND_RETURN("Internal error. cannot modify Prim's elementName.");
      }
      prim.element_path() = Path(elementName, /* prop_part */"");
    } else {
      PUSH_ERROR_AND_RETURN(fmt::format("Prim name(elementName) {} already exists in children.\n", prim.element_name()));
    }
  }


  _root_node_nameSet.insert(elementName);
  _root_nodes.emplace_back(std::move(prim));

  _dirty = true;

  return true;


}